

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

void __thiscall
slang::ast::SampledValueExprVisitor::visit<slang::ast::AssertionInstanceExpression>
          (SampledValueExprVisitor *this,AssertionInstanceExpression *expr)

{
  ExpressionKind EVar1;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  bool bVar2;
  AssertionPortSymbol *this_00;
  reference ppEVar3;
  Type *this_01;
  size_t sVar4;
  bool local_d1;
  string_view local_a8;
  Scope *local_98;
  Symbol *local_90;
  DiagCode local_84;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_80;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  CallExpression *local_40;
  CallExpression *call;
  Symbol *local_30;
  DiagCode local_24;
  Symbol *local_20;
  Symbol *sym;
  AssertionInstanceExpression *expr_local;
  SampledValueExprVisitor *this_local;
  
  EVar1 = (expr->super_Expression).kind;
  sym = (Symbol *)expr;
  expr_local = (AssertionInstanceExpression *)this;
  if (EVar1 == NamedValue) {
    local_20 = Expression::getSymbolReference(&expr->super_Expression,true);
    if (local_20 != (Symbol *)0x0) {
      if (local_20->kind != LocalAssertionVar) {
        if (local_20->kind != AssertionPort) {
          return;
        }
        this_00 = Symbol::as<slang::ast::AssertionPortSymbol>(local_20);
        bVar2 = AssertionPortSymbol::isLocalVar(this_00);
        if (!bVar2) {
          return;
        }
      }
      local_24 = this->localVarCode;
      call = (CallExpression *)sym->parentScope;
      local_30 = sym->nextInScope;
      sourceRange.startLoc = (SourceLocation)sym->parentScope;
      sourceRange.endLoc = (SourceLocation)sym->nextInScope;
      ASTContext::addDiag(this->context,local_24,sourceRange);
    }
  }
  else if (EVar1 == Call) {
    local_40 = Expression::as<slang::ast::CallExpression>(&expr->super_Expression);
    bVar2 = CallExpression::isSystemCall(local_40);
    if (bVar2) {
      local_50 = CallExpression::getSubroutineName(local_40);
      local_60 = sv("matched",7);
      bVar2 = std::operator==(local_50,local_60);
      local_d1 = false;
      if (bVar2) {
        local_70 = CallExpression::arguments(local_40);
        bVar2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>
                ::empty(&local_70);
        local_d1 = false;
        if (!bVar2) {
          local_80 = CallExpression::arguments(local_40);
          ppEVar3 = nonstd::span_lite::
                    span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                              (&local_80,0);
          this_01 = not_null<const_slang::ast::Type_*>::operator->(&(*ppEVar3)->type);
          local_d1 = Type::isSequenceType(this_01);
        }
      }
      if (local_d1 != false) {
        local_84 = this->matchedCode;
        local_98 = sym->parentScope;
        local_90 = sym->nextInScope;
        sourceRange_00.startLoc = (SourceLocation)sym->parentScope;
        sourceRange_00.endLoc = (SourceLocation)sym->nextInScope;
        ASTContext::addDiag(this->context,local_84,sourceRange_00);
      }
      bVar2 = false;
      if ((this->isFutureGlobal & 1U) != 0) {
        local_a8 = CallExpression::getSubroutineName(local_40);
        sVar4 = ska::detailv3::
                sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                ::count(&FutureGlobalNames.
                         super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        ,&local_a8);
        bVar2 = sVar4 != 0;
      }
      if (bVar2) {
        sourceRange_01.startLoc = (SourceLocation)sym->parentScope;
        sourceRange_01.endLoc = (SourceLocation)sym->nextInScope;
        ASTContext::addDiag(this->context,(DiagCode)0x180008,sourceRange_01);
      }
    }
  }
  else {
    AssertionInstanceExpression::visitExprs<slang::ast::SampledValueExprVisitor&>(expr,this);
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::LocalAssertionVar ||
                            (sym->kind == SymbolKind::AssertionPort &&
                             sym->template as<AssertionPortSymbol>().isLocalVar())) {
                            context.addDiag(localVarCode, expr.sourceRange);
                        }
                    }
                    break;
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.isSystemCall()) {
                        if (call.getSubroutineName() == "matched"sv && !call.arguments().empty() &&
                            call.arguments()[0]->type->isSequenceType()) {
                            context.addDiag(matchedCode, expr.sourceRange);
                        }

                        if (isFutureGlobal && FutureGlobalNames.count(call.getSubroutineName())) {
                            context.addDiag(diag::GlobalSampledValueNested, expr.sourceRange);
                        }
                    }
                    break;
                }
                default:
                    if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T,
                                                SampledValueExprVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }